

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOPinData.cpp
# Opt level: O0

vector<GPIO::PinDefinition,_std::allocator<GPIO::PinDefinition>_> *
GPIO::EntirePinData::_JETSON_NANO_PIN_DEFS(void)

{
  initializer_list<GPIO::PinDefinition> __l;
  vector<GPIO::PinDefinition,_std::allocator<GPIO::PinDefinition>_> *in_RDI;
  PinDefinition *in_stack_ffffffffffffcf40;
  string *in_stack_ffffffffffffcf48;
  DictionaryLike *in_stack_ffffffffffffcf50;
  allocator_type *in_stack_ffffffffffffcf68;
  undefined1 ***pppuVar1;
  vector<GPIO::PinDefinition,_std::allocator<GPIO::PinDefinition>_> *in_stack_ffffffffffffcf70;
  undefined1 ***pppuVar2;
  iterator in_stack_ffffffffffffcf78;
  undefined1 *puVar3;
  undefined1 local_275d;
  undefined1 local_275c;
  undefined1 local_275b;
  undefined1 local_275a;
  undefined1 local_2759;
  undefined1 local_2758;
  undefined1 local_2757;
  undefined1 local_2756;
  allocator local_2755;
  allocator local_2754;
  allocator local_2753;
  allocator local_2752;
  allocator local_2751;
  string local_2750 [32];
  string local_2730 [37];
  undefined1 local_270b;
  undefined1 local_270a;
  undefined1 local_2709;
  undefined1 local_2708;
  undefined1 local_2707;
  undefined1 local_2706;
  allocator local_2705;
  allocator local_2704;
  allocator local_2703;
  allocator local_2702;
  allocator local_2701;
  string local_2700 [32];
  string local_26e0 [37];
  undefined1 local_26bb;
  undefined1 local_26ba;
  undefined1 local_26b9;
  undefined1 local_26b8;
  undefined1 local_26b7;
  undefined1 local_26b6;
  allocator local_26b5;
  allocator local_26b4;
  allocator local_26b3;
  allocator local_26b2;
  allocator local_26b1;
  string local_26b0 [32];
  string local_2690 [37];
  undefined1 local_266b;
  undefined1 local_266a;
  undefined1 local_2669;
  undefined1 local_2668;
  undefined1 local_2667;
  undefined1 local_2666;
  allocator local_2665;
  allocator local_2664;
  allocator local_2663;
  allocator local_2662;
  allocator local_2661;
  string local_2660 [32];
  string local_2640 [37];
  undefined1 local_261b;
  undefined1 local_261a;
  undefined1 local_2619;
  undefined1 local_2618;
  undefined1 local_2617;
  undefined1 local_2616;
  allocator local_2615;
  allocator local_2614;
  allocator local_2613;
  allocator local_2612;
  allocator local_2611;
  string local_2610 [32];
  string local_25f0 [35];
  undefined1 local_25cd;
  undefined1 local_25cc;
  undefined1 local_25cb;
  undefined1 local_25ca;
  undefined1 local_25c9;
  undefined1 local_25c8;
  undefined1 local_25c7;
  allocator local_25c6;
  allocator local_25c5;
  allocator local_25c4;
  allocator local_25c3;
  allocator local_25c2;
  allocator local_25c1;
  string local_25c0 [32];
  string local_25a0 [35];
  undefined1 local_257d;
  undefined1 local_257c;
  undefined1 local_257b;
  undefined1 local_257a;
  undefined1 local_2579;
  undefined1 local_2578;
  undefined1 local_2577;
  allocator local_2576;
  allocator local_2575;
  allocator local_2574;
  allocator local_2573;
  allocator local_2572;
  allocator local_2571;
  string local_2570 [32];
  string local_2550 [37];
  undefined1 local_252b;
  undefined1 local_252a;
  undefined1 local_2529;
  undefined1 local_2528;
  undefined1 local_2527;
  undefined1 local_2526;
  allocator local_2525;
  allocator local_2524;
  allocator local_2523;
  allocator local_2522;
  allocator local_2521;
  string local_2520 [32];
  string local_2500 [37];
  undefined1 local_24db;
  undefined1 local_24da;
  undefined1 local_24d9;
  undefined1 local_24d8;
  undefined1 local_24d7;
  undefined1 local_24d6;
  allocator local_24d5;
  allocator local_24d4;
  allocator local_24d3;
  allocator local_24d2;
  allocator local_24d1;
  string local_24d0 [32];
  string local_24b0 [37];
  undefined1 local_248b;
  undefined1 local_248a;
  undefined1 local_2489;
  undefined1 local_2488;
  undefined1 local_2487;
  undefined1 local_2486;
  allocator local_2485;
  allocator local_2484;
  allocator local_2483;
  allocator local_2482;
  allocator local_2481;
  string local_2480 [32];
  string local_2460 [37];
  undefined1 local_243b;
  undefined1 local_243a;
  undefined1 local_2439;
  undefined1 local_2438;
  undefined1 local_2437;
  undefined1 local_2436;
  allocator local_2435;
  allocator local_2434;
  allocator local_2433;
  allocator local_2432;
  allocator local_2431;
  string local_2430 [32];
  string local_2410 [37];
  undefined1 local_23eb;
  undefined1 local_23ea;
  undefined1 local_23e9;
  undefined1 local_23e8;
  undefined1 local_23e7;
  undefined1 local_23e6;
  allocator local_23e5;
  allocator local_23e4;
  allocator local_23e3;
  allocator local_23e2;
  allocator local_23e1;
  string local_23e0 [32];
  string local_23c0 [37];
  undefined1 local_239b;
  undefined1 local_239a;
  undefined1 local_2399;
  undefined1 local_2398;
  undefined1 local_2397;
  undefined1 local_2396;
  allocator local_2395;
  allocator local_2394;
  allocator local_2393;
  allocator local_2392;
  allocator local_2391;
  string local_2390 [32];
  string local_2370 [37];
  undefined1 local_234b;
  undefined1 local_234a;
  undefined1 local_2349;
  undefined1 local_2348;
  undefined1 local_2347;
  undefined1 local_2346;
  allocator local_2345;
  allocator local_2344;
  allocator local_2343;
  allocator local_2342;
  allocator local_2341;
  string local_2340 [32];
  string local_2320 [37];
  undefined1 local_22fb;
  undefined1 local_22fa;
  undefined1 local_22f9;
  undefined1 local_22f8;
  undefined1 local_22f7;
  undefined1 local_22f6;
  allocator local_22f5;
  allocator local_22f4;
  allocator local_22f3;
  allocator local_22f2;
  allocator local_22f1;
  string local_22f0 [32];
  string local_22d0 [37];
  undefined1 local_22ab;
  undefined1 local_22aa;
  undefined1 local_22a9;
  undefined1 local_22a8;
  undefined1 local_22a7;
  undefined1 local_22a6;
  allocator local_22a5;
  allocator local_22a4;
  allocator local_22a3;
  allocator local_22a2;
  allocator local_22a1;
  string local_22a0 [32];
  string local_2280 [37];
  undefined1 local_225b;
  undefined1 local_225a;
  undefined1 local_2259;
  undefined1 local_2258;
  undefined1 local_2257;
  undefined1 local_2256;
  allocator local_2255;
  allocator local_2254;
  allocator local_2253;
  allocator local_2252;
  allocator local_2251;
  string local_2250 [32];
  string local_2230 [37];
  undefined1 local_220b;
  undefined1 local_220a;
  undefined1 local_2209;
  undefined1 local_2208;
  undefined1 local_2207;
  undefined1 local_2206;
  allocator local_2205;
  allocator local_2204;
  allocator local_2203;
  allocator local_2202;
  allocator local_2201;
  string local_2200 [32];
  string local_21e0 [37];
  undefined1 local_21bb;
  undefined1 local_21ba;
  undefined1 local_21b9;
  undefined1 local_21b8;
  undefined1 local_21b7;
  undefined1 local_21b6;
  allocator local_21b5;
  allocator local_21b4;
  allocator local_21b3;
  allocator local_21b2;
  allocator local_21b1;
  string local_21b0 [32];
  string local_2190 [37];
  undefined1 local_216b;
  undefined1 local_216a;
  undefined1 local_2169;
  undefined1 local_2168;
  undefined1 local_2167;
  undefined1 local_2166;
  allocator local_2165;
  allocator local_2164;
  allocator local_2163;
  allocator local_2162;
  allocator local_2161;
  string local_2160 [32];
  string local_2140 [37];
  undefined1 local_211b;
  undefined1 local_211a;
  undefined1 local_2119;
  undefined1 local_2118;
  undefined1 local_2117;
  undefined1 local_2116;
  allocator local_2115;
  allocator local_2114;
  allocator local_2113;
  allocator local_2112;
  allocator local_2111;
  string local_2110 [32];
  string local_20f0 [37];
  undefined1 local_20cb;
  undefined1 local_20ca;
  undefined1 local_20c9;
  undefined1 local_20c8;
  undefined1 local_20c7;
  undefined1 local_20c6;
  allocator local_20c5;
  allocator local_20c4;
  allocator local_20c3;
  allocator local_20c2;
  allocator local_20c1;
  string local_20c0 [48];
  string local_2090 [32];
  undefined1 **local_2070;
  undefined8 *local_2068 [22];
  string local_1fb8 [32];
  string local_1f98 [32];
  string local_1f78 [32];
  string local_1f58 [32];
  string local_1f38 [64];
  int local_1ef8;
  undefined1 local_1ef0 [176];
  string asStack_1e40 [32];
  string asStack_1e20 [32];
  string asStack_1e00 [32];
  string asStack_1de0 [32];
  string asStack_1dc0 [64];
  int local_1d80;
  undefined1 local_1d78 [176];
  string asStack_1cc8 [32];
  string asStack_1ca8 [32];
  string asStack_1c88 [32];
  string asStack_1c68 [32];
  string asStack_1c48 [64];
  int local_1c08;
  undefined1 local_1c00 [176];
  string asStack_1b50 [32];
  string asStack_1b30 [32];
  string asStack_1b10 [32];
  string asStack_1af0 [32];
  string asStack_1ad0 [64];
  int local_1a90;
  undefined1 local_1a88 [176];
  string asStack_19d8 [32];
  string asStack_19b8 [32];
  string asStack_1998 [32];
  string asStack_1978 [32];
  string asStack_1958 [64];
  int local_1918;
  undefined1 local_1910 [176];
  string asStack_1860 [32];
  string asStack_1840 [32];
  string asStack_1820 [32];
  string asStack_1800 [32];
  string asStack_17e0 [64];
  int local_17a0;
  undefined1 local_1798 [176];
  string asStack_16e8 [32];
  string asStack_16c8 [32];
  string asStack_16a8 [32];
  string asStack_1688 [32];
  string asStack_1668 [64];
  int local_1628;
  undefined1 local_1620 [176];
  string asStack_1570 [32];
  string asStack_1550 [32];
  string asStack_1530 [32];
  string asStack_1510 [32];
  string asStack_14f0 [64];
  int local_14b0;
  undefined1 local_14a8 [176];
  string asStack_13f8 [32];
  string asStack_13d8 [32];
  string asStack_13b8 [32];
  string asStack_1398 [32];
  string asStack_1378 [64];
  int local_1338;
  undefined1 local_1330 [176];
  string asStack_1280 [32];
  string asStack_1260 [32];
  string asStack_1240 [32];
  string asStack_1220 [32];
  string asStack_1200 [64];
  int local_11c0;
  undefined1 local_11b8 [176];
  string asStack_1108 [32];
  string asStack_10e8 [32];
  string asStack_10c8 [32];
  string asStack_10a8 [32];
  string asStack_1088 [64];
  int local_1048;
  undefined1 local_1040 [176];
  string asStack_f90 [32];
  string asStack_f70 [32];
  string asStack_f50 [32];
  string asStack_f30 [32];
  string asStack_f10 [64];
  int local_ed0;
  undefined1 local_ec8 [176];
  string asStack_e18 [32];
  string asStack_df8 [32];
  string asStack_dd8 [32];
  string asStack_db8 [32];
  string asStack_d98 [64];
  int local_d58;
  undefined1 local_d50 [176];
  string asStack_ca0 [32];
  string asStack_c80 [32];
  string asStack_c60 [32];
  string asStack_c40 [32];
  string asStack_c20 [64];
  int local_be0;
  undefined1 local_bd8 [176];
  string asStack_b28 [32];
  string asStack_b08 [32];
  string asStack_ae8 [32];
  string asStack_ac8 [32];
  string asStack_aa8 [64];
  int local_a68;
  undefined1 local_a60 [176];
  string asStack_9b0 [32];
  string asStack_990 [32];
  string asStack_970 [32];
  string asStack_950 [32];
  string asStack_930 [32];
  string asStack_910 [32];
  undefined4 local_8f0;
  undefined1 local_8e8 [176];
  string asStack_838 [32];
  string asStack_818 [32];
  string asStack_7f8 [32];
  string asStack_7d8 [32];
  string asStack_7b8 [32];
  string asStack_798 [32];
  undefined4 local_778;
  undefined1 local_770 [176];
  string asStack_6c0 [32];
  string asStack_6a0 [32];
  string asStack_680 [32];
  string asStack_660 [32];
  string asStack_640 [64];
  int local_600;
  undefined1 local_5f8 [176];
  string asStack_548 [32];
  string asStack_528 [32];
  string asStack_508 [32];
  string asStack_4e8 [32];
  string asStack_4c8 [64];
  int local_488;
  undefined1 local_480 [176];
  string asStack_3d0 [32];
  string asStack_3b0 [32];
  string asStack_390 [32];
  string asStack_370 [32];
  string asStack_350 [64];
  int local_310;
  undefined1 local_308 [176];
  string asStack_258 [32];
  string asStack_238 [32];
  string asStack_218 [32];
  string asStack_1f8 [32];
  string asStack_1d8 [64];
  int local_198;
  undefined1 local_190 [176];
  string asStack_e0 [32];
  string asStack_c0 [32];
  string asStack_a0 [32];
  string asStack_80 [32];
  string asStack_60 [64];
  int local_20;
  undefined1 **local_18;
  undefined8 local_10;
  
  local_275c = 1;
  local_2070 = (undefined1 **)local_2068;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_20cb = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_20ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1fb8,"6000d000.gpio",&local_20c1);
  local_20c9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f98,"7",&local_20c2);
  local_20c8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f78,"4",&local_20c3);
  local_20c7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f58,"GPIO9",&local_20c4);
  local_20c6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f38,"AUD_MCLK",&local_20c5);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_1ef8 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_20c6 = 0;
  local_20c7 = 0;
  local_20c8 = 0;
  local_20c9 = 0;
  local_20ca = 0;
  local_20cb = 0;
  local_2070 = (undefined1 **)local_1ef0;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_211b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_211a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1e40,"6000d000.gpio",&local_2111);
  local_2119 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1e20,"11",&local_2112);
  local_2118 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1e00,"17",&local_2113);
  local_2117 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1de0,"UART1_RTS",&local_2114);
  local_2116 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1dc0,"UART2_RTS",&local_2115);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_1d80 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2116 = 0;
  local_2117 = 0;
  local_2118 = 0;
  local_2119 = 0;
  local_211a = 0;
  local_211b = 0;
  local_2070 = (undefined1 **)local_1d78;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_216b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_216a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1cc8,"6000d000.gpio",&local_2161);
  local_2169 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1ca8,"12",&local_2162);
  local_2168 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1c88,"18",&local_2163);
  local_2167 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1c68,"I2S0_SCLK",&local_2164);
  local_2166 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1c48,"DAP4_SCLK",&local_2165);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_1c08 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2166 = 0;
  local_2167 = 0;
  local_2168 = 0;
  local_2169 = 0;
  local_216a = 0;
  local_216b = 0;
  local_2070 = (undefined1 **)local_1c00;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_21bb = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_21ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1b50,"6000d000.gpio",&local_21b1);
  local_21b9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1b30,"13",&local_21b2);
  local_21b8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1b10,"27",&local_21b3);
  local_21b7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1af0,"SPI1_SCK",&local_21b4);
  local_21b6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1ad0,"SPI2_SCK",&local_21b5);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_1a90 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_21b6 = 0;
  local_21b7 = 0;
  local_21b8 = 0;
  local_21b9 = 0;
  local_21ba = 0;
  local_21bb = 0;
  local_2070 = (undefined1 **)local_1a88;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_220b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_220a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_19d8,"6000d000.gpio",&local_2201);
  local_2209 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_19b8,"15",&local_2202);
  local_2208 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1998,"22",&local_2203);
  local_2207 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1978,"GPIO12",&local_2204);
  local_2206 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1958,"LCD_TE",&local_2205);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_1918 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2206 = 0;
  local_2207 = 0;
  local_2208 = 0;
  local_2209 = 0;
  local_220a = 0;
  local_220b = 0;
  local_2070 = (undefined1 **)local_1910;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_225b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_225a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1860,"6000d000.gpio",&local_2251);
  local_2259 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1840,"16",&local_2252);
  local_2258 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1820,"23",&local_2253);
  local_2257 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1800,"SPI1_CS1",&local_2254);
  local_2256 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_17e0,"SPI2_CS1",&local_2255);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_17a0 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2256 = 0;
  local_2257 = 0;
  local_2258 = 0;
  local_2259 = 0;
  local_225a = 0;
  local_225b = 0;
  local_2070 = (undefined1 **)local_1798;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_22ab = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_22aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_16e8,"6000d000.gpio",&local_22a1);
  local_22a9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_16c8,"18",&local_22a2);
  local_22a8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_16a8,"24",&local_22a3);
  local_22a7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1688,"SPI1_CS0",&local_22a4);
  local_22a6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1668,"SPI2_CS0",&local_22a5);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_1628 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_22a6 = 0;
  local_22a7 = 0;
  local_22a8 = 0;
  local_22a9 = 0;
  local_22aa = 0;
  local_22ab = 0;
  local_2070 = (undefined1 **)local_1620;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_22fb = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_22fa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1570,"6000d000.gpio",&local_22f1);
  local_22f9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1550,"19",&local_22f2);
  local_22f8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1530,"10",&local_22f3);
  local_22f7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1510,"SPI0_MOSI",&local_22f4);
  local_22f6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_14f0,"SPI1_MOSI",&local_22f5);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_14b0 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_22f6 = 0;
  local_22f7 = 0;
  local_22f8 = 0;
  local_22f9 = 0;
  local_22fa = 0;
  local_22fb = 0;
  local_2070 = (undefined1 **)local_14a8;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_234b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_234a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_13f8,"6000d000.gpio",&local_2341);
  local_2349 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_13d8,"21",&local_2342);
  local_2348 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_13b8,"9",&local_2343);
  local_2347 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1398,"SPI0_MISO",&local_2344);
  local_2346 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1378,"SPI1_MISO",&local_2345);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_1338 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2346 = 0;
  local_2347 = 0;
  local_2348 = 0;
  local_2349 = 0;
  local_234a = 0;
  local_234b = 0;
  local_2070 = (undefined1 **)local_1330;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_239b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_239a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1280,"6000d000.gpio",&local_2391);
  local_2399 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1260,"22",&local_2392);
  local_2398 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1240,"25",&local_2393);
  local_2397 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1220,"SPI1_MISO",&local_2394);
  local_2396 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1200,"SPI2_MISO",&local_2395);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_11c0 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2396 = 0;
  local_2397 = 0;
  local_2398 = 0;
  local_2399 = 0;
  local_239a = 0;
  local_239b = 0;
  local_2070 = (undefined1 **)local_11b8;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_23eb = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_23ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1108,"6000d000.gpio",&local_23e1);
  local_23e9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_10e8,"23",&local_23e2);
  local_23e8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_10c8,"11",&local_23e3);
  local_23e7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_10a8,"SPI0_SCK",&local_23e4);
  local_23e6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1088,"SPI1_SCK",&local_23e5);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_1048 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_23e6 = 0;
  local_23e7 = 0;
  local_23e8 = 0;
  local_23e9 = 0;
  local_23ea = 0;
  local_23eb = 0;
  local_2070 = (undefined1 **)local_1040;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_243b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_243a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_f90,"6000d000.gpio",&local_2431);
  local_2439 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_f70,"24",&local_2432);
  local_2438 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_f50,"8",&local_2433);
  local_2437 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_f30,"SPI0_CS0",&local_2434);
  local_2436 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_f10,"SPI1_CS0",&local_2435);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_ed0 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2436 = 0;
  local_2437 = 0;
  local_2438 = 0;
  local_2439 = 0;
  local_243a = 0;
  local_243b = 0;
  local_2070 = (undefined1 **)local_ec8;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_248b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_248a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_e18,"6000d000.gpio",&local_2481);
  local_2489 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_df8,"26",&local_2482);
  local_2488 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_dd8,"7",&local_2483);
  local_2487 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_db8,"SPI0_CS1",&local_2484);
  local_2486 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_d98,"SPI1_CS1",&local_2485);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_d58 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2486 = 0;
  local_2487 = 0;
  local_2488 = 0;
  local_2489 = 0;
  local_248a = 0;
  local_248b = 0;
  local_2070 = (undefined1 **)local_d50;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_24db = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_24da = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_ca0,"6000d000.gpio",&local_24d1);
  local_24d9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_c80,"29",&local_24d2);
  local_24d8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_c60,"5",&local_24d3);
  local_24d7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_c40,"GPIO01",&local_24d4);
  local_24d6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_c20,"CAM_AF_EN",&local_24d5);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_be0 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_24d6 = 0;
  local_24d7 = 0;
  local_24d8 = 0;
  local_24d9 = 0;
  local_24da = 0;
  local_24db = 0;
  local_2070 = (undefined1 **)local_bd8;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_252b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_252a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_b28,"6000d000.gpio",&local_2521);
  local_2529 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_b08,"31",&local_2522);
  local_2528 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_ae8,"6",&local_2523);
  local_2527 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_ac8,"GPIO11",&local_2524);
  local_2526 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_aa8,"GPIO_PZ0",&local_2525);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_a68 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2526 = 0;
  local_2527 = 0;
  local_2528 = 0;
  local_2529 = 0;
  local_252a = 0;
  local_252b = 0;
  local_2070 = (undefined1 **)local_a60;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_257d = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_257c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_9b0,"6000d000.gpio",&local_2571);
  local_257b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_990,"32",&local_2572);
  local_257a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_970,"12",&local_2573);
  local_2579 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_950,"GPIO07",&local_2574);
  local_2578 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_930,"LCD_BL_PW",&local_2575);
  local_2577 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_910,"7000a000.pwm",&local_2576);
  local_8f0 = 0;
  local_2577 = 0;
  local_2578 = 0;
  local_2579 = 0;
  local_257a = 0;
  local_257b = 0;
  local_257c = 0;
  local_257d = 0;
  local_2070 = (undefined1 **)local_8e8;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_25cd = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_25cc = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_838,"6000d000.gpio",&local_25c1);
  local_25cb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_818,"33",&local_25c2);
  local_25ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_7f8,"13",&local_25c3);
  local_25c9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_7d8,"GPIO13",&local_25c4);
  local_25c8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_7b8,"GPIO_PE6",&local_25c5);
  local_25c7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_798,"7000a000.pwm",&local_25c6);
  local_778 = 2;
  local_25c7 = 0;
  local_25c8 = 0;
  local_25c9 = 0;
  local_25ca = 0;
  local_25cb = 0;
  local_25cc = 0;
  local_25cd = 0;
  local_2070 = (undefined1 **)local_770;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_261b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_261a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_6c0,"6000d000.gpio",&local_2611);
  local_2619 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_6a0,"35",&local_2612);
  local_2618 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_680,"19",&local_2613);
  local_2617 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_660,"I2S0_FS",&local_2614);
  local_2616 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_640,"DAP4_FS",&local_2615);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_600 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2616 = 0;
  local_2617 = 0;
  local_2618 = 0;
  local_2619 = 0;
  local_261a = 0;
  local_261b = 0;
  local_2070 = (undefined1 **)local_5f8;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_266b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_266a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_548,"6000d000.gpio",&local_2661);
  local_2669 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_528,"36",&local_2662);
  local_2668 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_508,"16",&local_2663);
  local_2667 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_4e8,"UART1_CTS",&local_2664);
  local_2666 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_4c8,"UART2_CTS",&local_2665);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_488 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2666 = 0;
  local_2667 = 0;
  local_2668 = 0;
  local_2669 = 0;
  local_266a = 0;
  local_266b = 0;
  local_2070 = (undefined1 **)local_480;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_26bb = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_26ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_3d0,"6000d000.gpio",&local_26b1);
  local_26b9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_3b0,"37",&local_26b2);
  local_26b8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_390,"26",&local_26b3);
  local_26b7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_370,"SPI1_MOSI",&local_26b4);
  local_26b6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_350,"SPI2_MOSI",&local_26b5);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_310 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_26b6 = 0;
  local_26b7 = 0;
  local_26b8 = 0;
  local_26b9 = 0;
  local_26ba = 0;
  local_26bb = 0;
  local_2070 = (undefined1 **)local_308;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_270b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_270a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_258,"6000d000.gpio",&local_2701);
  local_2709 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_238,"38",&local_2702);
  local_2708 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_218,"20",&local_2703);
  local_2707 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1f8,"I2S0_DIN",&local_2704);
  local_2706 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1d8,"DAP4_DIN",&local_2705);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_198 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2706 = 0;
  local_2707 = 0;
  local_2708 = 0;
  local_2709 = 0;
  local_270a = 0;
  local_270b = 0;
  local_2070 = (undefined1 **)local_190;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_275b = 1;
  s_abi_cxx11_((char *)in_stack_ffffffffffffcf78,(size_t)in_stack_ffffffffffffcf70);
  DictionaryLike::DictionaryLike(in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48);
  local_275a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_e0,"6000d000.gpio",&local_2751);
  local_2759 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_c0,"40",&local_2752);
  local_2758 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_a0,"21",&local_2753);
  local_2757 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_80,"I2S0_DOUT",&local_2754);
  local_2756 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_60,"DAP4_DOUT",&local_2755);
  NoneType::operator_cast_to_string((NoneType *)in_stack_ffffffffffffcf68);
  local_20 = NoneType::operator_cast_to_int((NoneType *)&None);
  local_2756 = 0;
  local_2757 = 0;
  local_2758 = 0;
  local_2759 = 0;
  local_275a = 0;
  local_275b = 0;
  local_275c = 0;
  local_18 = (undefined1 **)local_2068;
  local_10 = 0x16;
  puVar3 = &local_275d;
  std::allocator<GPIO::PinDefinition>::allocator((allocator<GPIO::PinDefinition> *)0x1b89a9);
  __l._M_len = (size_type)puVar3;
  __l._M_array = in_stack_ffffffffffffcf78;
  std::vector<GPIO::PinDefinition,_std::allocator<GPIO::PinDefinition>_>::vector
            (in_stack_ffffffffffffcf70,__l,in_stack_ffffffffffffcf68);
  std::allocator<GPIO::PinDefinition>::~allocator((allocator<GPIO::PinDefinition> *)0x1b89da);
  pppuVar2 = (undefined1 ***)local_2068;
  pppuVar1 = &local_18;
  do {
    pppuVar1 = pppuVar1 + -0x2f;
    PinDefinition::~PinDefinition(in_stack_ffffffffffffcf40);
  } while (pppuVar1 != pppuVar2);
  std::allocator<char>::~allocator((allocator<char> *)&local_2755);
  std::allocator<char>::~allocator((allocator<char> *)&local_2754);
  std::allocator<char>::~allocator((allocator<char> *)&local_2753);
  std::allocator<char>::~allocator((allocator<char> *)&local_2752);
  std::allocator<char>::~allocator((allocator<char> *)&local_2751);
  std::__cxx11::string::~string(local_2750);
  std::__cxx11::string::~string(local_2730);
  std::allocator<char>::~allocator((allocator<char> *)&local_2705);
  std::allocator<char>::~allocator((allocator<char> *)&local_2704);
  std::allocator<char>::~allocator((allocator<char> *)&local_2703);
  std::allocator<char>::~allocator((allocator<char> *)&local_2702);
  std::allocator<char>::~allocator((allocator<char> *)&local_2701);
  std::__cxx11::string::~string(local_2700);
  std::__cxx11::string::~string(local_26e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_26b5);
  std::allocator<char>::~allocator((allocator<char> *)&local_26b4);
  std::allocator<char>::~allocator((allocator<char> *)&local_26b3);
  std::allocator<char>::~allocator((allocator<char> *)&local_26b2);
  std::allocator<char>::~allocator((allocator<char> *)&local_26b1);
  std::__cxx11::string::~string(local_26b0);
  std::__cxx11::string::~string(local_2690);
  std::allocator<char>::~allocator((allocator<char> *)&local_2665);
  std::allocator<char>::~allocator((allocator<char> *)&local_2664);
  std::allocator<char>::~allocator((allocator<char> *)&local_2663);
  std::allocator<char>::~allocator((allocator<char> *)&local_2662);
  std::allocator<char>::~allocator((allocator<char> *)&local_2661);
  std::__cxx11::string::~string(local_2660);
  std::__cxx11::string::~string(local_2640);
  std::allocator<char>::~allocator((allocator<char> *)&local_2615);
  std::allocator<char>::~allocator((allocator<char> *)&local_2614);
  std::allocator<char>::~allocator((allocator<char> *)&local_2613);
  std::allocator<char>::~allocator((allocator<char> *)&local_2612);
  std::allocator<char>::~allocator((allocator<char> *)&local_2611);
  std::__cxx11::string::~string(local_2610);
  std::__cxx11::string::~string(local_25f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_25c6);
  std::allocator<char>::~allocator((allocator<char> *)&local_25c5);
  std::allocator<char>::~allocator((allocator<char> *)&local_25c4);
  std::allocator<char>::~allocator((allocator<char> *)&local_25c3);
  std::allocator<char>::~allocator((allocator<char> *)&local_25c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_25c1);
  std::__cxx11::string::~string(local_25c0);
  std::__cxx11::string::~string(local_25a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2576);
  std::allocator<char>::~allocator((allocator<char> *)&local_2575);
  std::allocator<char>::~allocator((allocator<char> *)&local_2574);
  std::allocator<char>::~allocator((allocator<char> *)&local_2573);
  std::allocator<char>::~allocator((allocator<char> *)&local_2572);
  std::allocator<char>::~allocator((allocator<char> *)&local_2571);
  std::__cxx11::string::~string(local_2570);
  std::__cxx11::string::~string(local_2550);
  std::allocator<char>::~allocator((allocator<char> *)&local_2525);
  std::allocator<char>::~allocator((allocator<char> *)&local_2524);
  std::allocator<char>::~allocator((allocator<char> *)&local_2523);
  std::allocator<char>::~allocator((allocator<char> *)&local_2522);
  std::allocator<char>::~allocator((allocator<char> *)&local_2521);
  std::__cxx11::string::~string(local_2520);
  std::__cxx11::string::~string(local_2500);
  std::allocator<char>::~allocator((allocator<char> *)&local_24d5);
  std::allocator<char>::~allocator((allocator<char> *)&local_24d4);
  std::allocator<char>::~allocator((allocator<char> *)&local_24d3);
  std::allocator<char>::~allocator((allocator<char> *)&local_24d2);
  std::allocator<char>::~allocator((allocator<char> *)&local_24d1);
  std::__cxx11::string::~string(local_24d0);
  std::__cxx11::string::~string(local_24b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2485);
  std::allocator<char>::~allocator((allocator<char> *)&local_2484);
  std::allocator<char>::~allocator((allocator<char> *)&local_2483);
  std::allocator<char>::~allocator((allocator<char> *)&local_2482);
  std::allocator<char>::~allocator((allocator<char> *)&local_2481);
  std::__cxx11::string::~string(local_2480);
  std::__cxx11::string::~string(local_2460);
  std::allocator<char>::~allocator((allocator<char> *)&local_2435);
  std::allocator<char>::~allocator((allocator<char> *)&local_2434);
  std::allocator<char>::~allocator((allocator<char> *)&local_2433);
  std::allocator<char>::~allocator((allocator<char> *)&local_2432);
  std::allocator<char>::~allocator((allocator<char> *)&local_2431);
  std::__cxx11::string::~string(local_2430);
  std::__cxx11::string::~string(local_2410);
  std::allocator<char>::~allocator((allocator<char> *)&local_23e5);
  std::allocator<char>::~allocator((allocator<char> *)&local_23e4);
  std::allocator<char>::~allocator((allocator<char> *)&local_23e3);
  std::allocator<char>::~allocator((allocator<char> *)&local_23e2);
  std::allocator<char>::~allocator((allocator<char> *)&local_23e1);
  std::__cxx11::string::~string(local_23e0);
  std::__cxx11::string::~string(local_23c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2395);
  std::allocator<char>::~allocator((allocator<char> *)&local_2394);
  std::allocator<char>::~allocator((allocator<char> *)&local_2393);
  std::allocator<char>::~allocator((allocator<char> *)&local_2392);
  std::allocator<char>::~allocator((allocator<char> *)&local_2391);
  std::__cxx11::string::~string(local_2390);
  std::__cxx11::string::~string(local_2370);
  std::allocator<char>::~allocator((allocator<char> *)&local_2345);
  std::allocator<char>::~allocator((allocator<char> *)&local_2344);
  std::allocator<char>::~allocator((allocator<char> *)&local_2343);
  std::allocator<char>::~allocator((allocator<char> *)&local_2342);
  std::allocator<char>::~allocator((allocator<char> *)&local_2341);
  std::__cxx11::string::~string(local_2340);
  std::__cxx11::string::~string(local_2320);
  std::allocator<char>::~allocator((allocator<char> *)&local_22f5);
  std::allocator<char>::~allocator((allocator<char> *)&local_22f4);
  std::allocator<char>::~allocator((allocator<char> *)&local_22f3);
  std::allocator<char>::~allocator((allocator<char> *)&local_22f2);
  std::allocator<char>::~allocator((allocator<char> *)&local_22f1);
  std::__cxx11::string::~string(local_22f0);
  std::__cxx11::string::~string(local_22d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_22a5);
  std::allocator<char>::~allocator((allocator<char> *)&local_22a4);
  std::allocator<char>::~allocator((allocator<char> *)&local_22a3);
  std::allocator<char>::~allocator((allocator<char> *)&local_22a2);
  std::allocator<char>::~allocator((allocator<char> *)&local_22a1);
  std::__cxx11::string::~string(local_22a0);
  std::__cxx11::string::~string(local_2280);
  std::allocator<char>::~allocator((allocator<char> *)&local_2255);
  std::allocator<char>::~allocator((allocator<char> *)&local_2254);
  std::allocator<char>::~allocator((allocator<char> *)&local_2253);
  std::allocator<char>::~allocator((allocator<char> *)&local_2252);
  std::allocator<char>::~allocator((allocator<char> *)&local_2251);
  std::__cxx11::string::~string(local_2250);
  std::__cxx11::string::~string(local_2230);
  std::allocator<char>::~allocator((allocator<char> *)&local_2205);
  std::allocator<char>::~allocator((allocator<char> *)&local_2204);
  std::allocator<char>::~allocator((allocator<char> *)&local_2203);
  std::allocator<char>::~allocator((allocator<char> *)&local_2202);
  std::allocator<char>::~allocator((allocator<char> *)&local_2201);
  std::__cxx11::string::~string(local_2200);
  std::__cxx11::string::~string(local_21e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_21b5);
  std::allocator<char>::~allocator((allocator<char> *)&local_21b4);
  std::allocator<char>::~allocator((allocator<char> *)&local_21b3);
  std::allocator<char>::~allocator((allocator<char> *)&local_21b2);
  std::allocator<char>::~allocator((allocator<char> *)&local_21b1);
  std::__cxx11::string::~string(local_21b0);
  std::__cxx11::string::~string(local_2190);
  std::allocator<char>::~allocator((allocator<char> *)&local_2165);
  std::allocator<char>::~allocator((allocator<char> *)&local_2164);
  std::allocator<char>::~allocator((allocator<char> *)&local_2163);
  std::allocator<char>::~allocator((allocator<char> *)&local_2162);
  std::allocator<char>::~allocator((allocator<char> *)&local_2161);
  std::__cxx11::string::~string(local_2160);
  std::__cxx11::string::~string(local_2140);
  std::allocator<char>::~allocator((allocator<char> *)&local_2115);
  std::allocator<char>::~allocator((allocator<char> *)&local_2114);
  std::allocator<char>::~allocator((allocator<char> *)&local_2113);
  std::allocator<char>::~allocator((allocator<char> *)&local_2112);
  std::allocator<char>::~allocator((allocator<char> *)&local_2111);
  std::__cxx11::string::~string(local_2110);
  std::__cxx11::string::~string(local_20f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_20c5);
  std::allocator<char>::~allocator((allocator<char> *)&local_20c4);
  std::allocator<char>::~allocator((allocator<char> *)&local_20c3);
  std::allocator<char>::~allocator((allocator<char> *)&local_20c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_20c1);
  std::__cxx11::string::~string(local_20c0);
  std::__cxx11::string::~string(local_2090);
  return in_RDI;
}

Assistant:

static vector<PinDefinition> _JETSON_NANO_PIN_DEFS()
        {
            return {
                { "216"s, "{}"s, "6000d000.gpio", "7", "4",   "GPIO9",     "AUD_MCLK",  None,        None },
                { "50"s,  "{}"s, "6000d000.gpio", "11", "17", "UART1_RTS", "UART2_RTS", None,        None },
                { "79"s,  "{}"s, "6000d000.gpio", "12", "18", "I2S0_SCLK", "DAP4_SCLK", None,        None },
                { "14"s,  "{}"s, "6000d000.gpio", "13", "27", "SPI1_SCK",  "SPI2_SCK",  None,        None },
                { "194"s, "{}"s, "6000d000.gpio", "15", "22", "GPIO12",    "LCD_TE",    None,        None },
                { "232"s, "{}"s, "6000d000.gpio", "16", "23", "SPI1_CS1",  "SPI2_CS1",  None,        None },
                { "15"s,  "{}"s, "6000d000.gpio", "18", "24", "SPI1_CS0",  "SPI2_CS0",  None,        None },
                { "16"s,  "{}"s, "6000d000.gpio", "19", "10", "SPI0_MOSI", "SPI1_MOSI", None,        None },
                { "17"s,  "{}"s, "6000d000.gpio", "21", "9",  "SPI0_MISO", "SPI1_MISO", None,        None },
                { "13"s,  "{}"s, "6000d000.gpio", "22", "25", "SPI1_MISO", "SPI2_MISO", None,        None },
                { "18"s,  "{}"s, "6000d000.gpio", "23", "11", "SPI0_SCK",  "SPI1_SCK",  None,        None },
                { "19"s,  "{}"s, "6000d000.gpio", "24", "8",  "SPI0_CS0",  "SPI1_CS0",  None,        None },
                { "20"s,  "{}"s, "6000d000.gpio", "26", "7",  "SPI0_CS1",  "SPI1_CS1",  None,        None },
                { "149"s, "{}"s, "6000d000.gpio", "29", "5",  "GPIO01",    "CAM_AF_EN", None,        None },
                { "200"s, "{}"s, "6000d000.gpio", "31", "6",  "GPIO11",    "GPIO_PZ0",  None,        None },
                // Older versions of L4T have a DT bug which instantiates a bogus device
                // which prevents this library from using this PWM channel.
                { "168"s, "{}"s, "6000d000.gpio", "32", "12", "GPIO07",    "LCD_BL_PW", "7000a000.pwm", 0 },
                { "38"s,  "{}"s, "6000d000.gpio", "33", "13", "GPIO13",    "GPIO_PE6",  "7000a000.pwm", 2 },
                { "76"s,  "{}"s, "6000d000.gpio", "35", "19", "I2S0_FS",   "DAP4_FS",   None,        None },
                { "51"s,  "{}"s, "6000d000.gpio", "36", "16", "UART1_CTS", "UART2_CTS", None,        None },
                { "12"s,  "{}"s, "6000d000.gpio", "37", "26", "SPI1_MOSI", "SPI2_MOSI", None,        None },
                { "77"s,  "{}"s, "6000d000.gpio", "38", "20", "I2S0_DIN",  "DAP4_DIN",  None,        None },
                { "78"s,  "{}"s, "6000d000.gpio", "40", "21", "I2S0_DOUT", "DAP4_DOUT", None,        None }
            };
        }